

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::no_component::~no_component(no_component *this)

{
  no_component *this_local;
  
  ~no_component(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~no_component() throw() { }